

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.h
# Opt level: O0

string * __thiscall
flatbuffers::Namer::NamespacedType
          (string *__return_storage_ptr__,Namer *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ns,string *s)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  byte local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  byte local_4a;
  allocator<char> local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *s_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ns_local;
  Namer *this_local;
  
  local_28 = s;
  s_local = (string *)ns;
  ns_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this;
  this_local = (Namer *)__return_storage_ptr__;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(ns);
  local_4a = 0;
  local_81 = 0;
  if (bVar1) {
    std::allocator<char>::allocator();
    local_4a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
  }
  else {
    (*this->_vptr_Namer[10])(&local_80,this,s_local);
    local_81 = 1;
    std::operator+(&local_48,&local_80,&(this->config_).namespace_seperator);
  }
  (*this->_vptr_Namer[0xf])(&local_a8,this,local_28);
  std::operator+(__return_storage_ptr__,&local_48,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  if ((local_81 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_80);
  }
  if ((local_4a & 1) != 0) {
    std::allocator<char>::~allocator(&local_49);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string NamespacedType(const std::vector<std::string> &ns,
                                     const std::string &s) const {
    return (ns.empty() ? "" : (Namespace(ns) + config_.namespace_seperator)) +
           Type(s);
  }